

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRefCount.cpp
# Opt level: O1

void testRefCount(void)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  long *plVar4;
  
  plVar4 = (long *)operator_new(0x10);
  plVar4[1] = 0;
  testRefCount::count = testRefCount::count + 1;
  *plVar4 = (long)&PTR__TestObject_0010ad58;
  LOCK();
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  if (testRefCount::count != 1) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x13,"count == 1");
    if (iVar3 != 0) goto LAB_001027df;
  }
  LOCK();
  plVar1 = plVar4 + 1;
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  if (testRefCount::count != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x15,"count == 0");
    if (iVar3 != 0) goto LAB_001027df;
  }
  plVar4 = (long *)operator_new(0x10);
  plVar4[1] = 0;
  testRefCount::count = testRefCount::count + 1;
  *plVar4 = (long)&PTR__TestObject_0010ad58;
  LOCK();
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  LOCK();
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  LOCK();
  plVar4[1] = plVar4[1] + 1;
  UNLOCK();
  if (testRefCount::count != 1) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x20,"count == 1");
    if (iVar3 != 0) goto LAB_001027df;
  }
  LOCK();
  plVar1 = plVar4 + 1;
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  LOCK();
  plVar1 = plVar4 + 1;
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  LOCK();
  plVar1 = plVar4 + 1;
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  if (testRefCount::count != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x22,"count == 0");
    if (iVar3 != 0) {
LAB_001027df:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  return;
}

Assistant:

void testRefCount()
{
  static int count = 0;

  class TestObject : public RefCount::Object
  {
  public:
    TestObject() {++count;}
    ~TestObject() {--count;}
  };

  // test construction and destruction
  {
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

  // test copy constructor
  {
    RefCount::Ptr<TestObject> ptr3;
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(ptr != ptr3);
    RefCount::Ptr<TestObject> ptr2(ptr);
    ASSERT(ptr == ptr2);
    ptr3 = ptr2;
    ASSERT(ptr == ptr3);
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

}